

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O1

void __thiscall
CAddress::
SerializationOps<ParamsStream<VectorWriter&,CAddress::SerParams>,CAddress_const,ActionSerialize>
          (CAddress *this,ParamsStream<VectorWriter_&,_CAddress::SerParams> *obj,undefined8 param_3,
          size_t param_4)

{
  Encoding EVar1;
  SerParams *pSVar2;
  char *pcVar3;
  SerParams *pSVar4;
  long in_FS_OFFSET;
  bool bVar5;
  SerParams ser_params;
  uint64_t raw;
  Encoding local_44;
  undefined8 local_40;
  ParamsStream<VectorWriter_&,_CAddress::SerParams> *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar2 = obj->m_params;
  if (pSVar2->fmt == Network) {
    bVar5 = (pSVar2->super_SerParams).enc == V2;
  }
  else {
    if (pSVar2->fmt != Disk) {
      __assert_fail("params.fmt == Format::Network",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/protocol.h"
                    ,0x1b2,
                    "static void CAddress::SerializationOps(Type &, Stream &, Operation) [Stream = ParamsStream<VectorWriter &, CAddress::SerParams>, Type = const CAddress, Operation = ActionSerialize]"
                   );
    }
    EVar1 = (pSVar2->super_SerParams).enc;
    bVar5 = EVar1 == V2;
    local_40 = (Encoding *)(CONCAT44(local_40._4_4_,(uint)bVar5 << 0x1d) | 220000);
    VectorWriter::write(obj->m_substream,(int)&local_40,(void *)0x4,param_4);
    if ((EVar1 == V2) && ((pSVar2->super_SerParams).enc != V2)) {
      pcVar3 = (char *)__cxa_allocate_exception(0x20);
      local_38 = (ParamsStream<VectorWriter_&,_CAddress::SerParams> *)std::iostream_category();
      local_40 = (Encoding *)CONCAT44(local_40._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar3,(error_code *)"Unsupported CAddress disk format version");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        __cxa_throw(pcVar3,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_009298d2;
    }
  }
  local_40 = (Encoding *)CONCAT44(local_40._4_4_,(int)(this->nTime).__d.__r);
  VectorWriter::write(obj->m_substream,(int)&local_40,(void *)0x4,param_4);
  if (bVar5) {
    WriteCompactSize<ParamsStream<VectorWriter&,CAddress::SerParams>>(obj,this->nServices);
    pSVar4 = &CNetAddr::V2;
  }
  else {
    local_40 = (Encoding *)this->nServices;
    VectorWriter::write(obj->m_substream,(int)&local_40,&DAT_00000008,param_4);
    pSVar4 = &CNetAddr::V1;
  }
  local_44 = pSVar4->enc;
  local_40 = &local_44;
  local_38 = obj;
  CService::
  SerializationOps<ParamsStream<ParamsStream<VectorWriter&,CAddress::SerParams>&,CNetAddr::SerParams>,CService_const,ActionSerialize>
            (&this->super_CService);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_009298d2:
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(CAddress, obj)
    {
        bool use_v2;
        auto& params = SER_PARAMS(SerParams);
        if (params.fmt == Format::Disk) {
            // In the disk serialization format, the encoding (v1 or v2) is determined by a flag version
            // that's part of the serialization itself. ADDRV2_FORMAT in the stream version only determines
            // whether V2 is chosen/permitted at all.
            uint32_t stored_format_version = DISK_VERSION_INIT;
            if (params.enc == Encoding::V2) stored_format_version |= DISK_VERSION_ADDRV2;
            READWRITE(stored_format_version);
            stored_format_version &= ~DISK_VERSION_IGNORE_MASK; // ignore low bits
            if (stored_format_version == 0) {
                use_v2 = false;
            } else if (stored_format_version == DISK_VERSION_ADDRV2 && params.enc == Encoding::V2) {
                // Only support v2 deserialization if V2 is set.
                use_v2 = true;
            } else {
                throw std::ios_base::failure("Unsupported CAddress disk format version");
            }
        } else {
            assert(params.fmt == Format::Network);
            // In the network serialization format, the encoding (v1 or v2) is determined directly by
            // the value of enc in the stream params, as no explicitly encoded version
            // exists in the stream.
            use_v2 = params.enc == Encoding::V2;
        }

        READWRITE(Using<LossyChronoFormatter<uint32_t>>(obj.nTime));
        // nServices is serialized as CompactSize in V2; as uint64_t in V1.
        if (use_v2) {
            uint64_t services_tmp;
            SER_WRITE(obj, services_tmp = obj.nServices);
            READWRITE(Using<CompactSizeFormatter<false>>(services_tmp));
            SER_READ(obj, obj.nServices = static_cast<ServiceFlags>(services_tmp));
        } else {
            READWRITE(Using<CustomUintFormatter<8>>(obj.nServices));
        }
        // Invoke V1/V2 serializer for CService parent object.
        const auto ser_params{use_v2 ? CNetAddr::V2 : CNetAddr::V1};
        READWRITE(ser_params(AsBase<CService>(obj)));
    }